

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  byte *pbVar1;
  TTDVar pvVar2;
  
  pbVar1 = SlabAllocatorBase<0>::SlabAllocateTypeRawSize<56ul>(alloc);
  (*reader->_vptr_FileReader[3])(reader,3,1);
  pvVar2 = NSSnapValues::ParseTTDVar(false,reader);
  *(TTDVar *)pbVar1 = pvVar2;
  (*reader->_vptr_FileReader[3])(reader,7,1);
  NSSnapValues::ParsePromiseReactionInfo((SnapPromiseReactionInfo *)(pbVar1 + 8),false,reader,alloc)
  ;
  if (snpObject->SnapObjectTag == SnapPromiseReactionTaskFunctionObject) {
    snpObject->AddtlSnapObjectInfo = pbVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseReactionTaskFunctionInfo* rInfo = alloc.SlabAllocateStruct<SnapPromiseReactionTaskFunctionInfo>();

            reader->ReadKey(NSTokens::Key::entry, true);
            rInfo->Argument = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::reaction, true);
            NSSnapValues::ParsePromiseReactionInfo(&rInfo->Reaction, false, reader, alloc);

            SnapObjectSetAddtlInfoAs<SnapPromiseReactionTaskFunctionInfo*, SnapObjectType::SnapPromiseReactionTaskFunctionObject>(snpObject, rInfo);
        }